

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kss_Emu.cpp
# Opt level: O2

void copy_kss_fields(header_t *h,track_info_t *out)

{
  char *in;
  char *pcVar1;
  
  pcVar1 = "Game Gear";
  if ((h->device_flags & 4) == 0) {
    pcVar1 = "Sega Master System";
  }
  in = "MSX";
  if ((h->device_flags & 2) != 0) {
    in = pcVar1;
  }
  Gme_File::copy_field_(out->system,in);
  return;
}

Assistant:

static void copy_kss_fields( Kss_Emu::header_t const& h, track_info_t* out )
{
	const char* system = "MSX";
	if ( h.device_flags & 0x02 )
	{
		system = "Sega Master System";
		if ( h.device_flags & 0x04 )
			system = "Game Gear";
	}
	Gme_File::copy_field_( out->system, system );
}